

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O0

void __thiscall
disruptor::test::SequenceBarrier::BasicSetterAndGetter::test_method(BasicSetterAndGetter *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 alert;
  SequenceBarrier<disruptor::BusySpinStrategy> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined1 local_ca [18];
  undefined1 local_b8 [40];
  undefined1 local_90 [16];
  basic_cstring<const_char> local_80;
  undefined1 local_6e [30];
  undefined1 local_50 [40];
  undefined1 local_28 [16];
  basic_cstring<const_char> local_18;
  
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_18,0x3a,local_28);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffeb8,(char (*) [1])in_stack_fffffffffffffeb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_6e + 0xe),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    local_6e[1] = SequenceBarrier<disruptor::BusySpinStrategy>::alerted
                            ((SequenceBarrier<disruptor::BusySpinStrategy> *)0x10aef7);
    local_6e[0] = 0;
    in_stack_fffffffffffffeb8 = "false";
    in_stack_fffffffffffffeb0 = (SequenceBarrier<disruptor::BusySpinStrategy> *)local_6e;
    alert = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_50,local_6e + 0xe,0x3a,1,2,local_6e + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10af72);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SequenceBarrier<disruptor::BusySpinStrategy>::set_alerted(in_stack_fffffffffffffeb0,(bool)alert);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x3c,local_90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffeb8,(char (*) [1])in_stack_fffffffffffffeb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_ca + 2),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    local_ca[1] = SequenceBarrier<disruptor::BusySpinStrategy>::alerted
                            ((SequenceBarrier<disruptor::BusySpinStrategy> *)0x10b040);
    local_ca[0] = 1;
    in_stack_fffffffffffffeb8 = "true";
    in_stack_fffffffffffffeb0 = (SequenceBarrier<disruptor::BusySpinStrategy> *)local_ca;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_b8,local_ca + 2,0x3c,1,2,local_ca + 1,"barrier.alerted()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10b0bb);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(BasicSetterAndGetter) {
  BOOST_CHECK_EQUAL(barrier.alerted(), false);
  barrier.set_alerted(true);
  BOOST_CHECK_EQUAL(barrier.alerted(), true);
}